

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::qualRedCostViolation
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  uint *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  long lVar4;
  long lVar5;
  double local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  cpp_dec_float<100U,_int,_void> *local_38;
  
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)maxviol,0.0);
  local_38 = &sumviol->m_backend;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)sumviol,0.0);
  if (this->theType == ENTER) {
    lVar4 = 0x48;
    for (lVar5 = 0; lVar5 < (this->thecovectors->set).thenum; lVar5 = lVar5 + 1) {
      pnVar2 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x48);
      local_88.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x38);
      local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x28);
      local_88.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x18);
      local_88.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar4 + -8);
      local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar4 + -4);
      local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4);
      local_90 = 0.0;
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_88,&local_90);
      if (tVar3) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (local_38,&local_88);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_88,maxviol);
        if (tVar3) {
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_88.data._M_elems._48_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe) = local_88.data._M_elems._56_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_88.data._M_elems._32_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_88.data._M_elems._40_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_88.data._M_elems._16_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_88.data._M_elems._24_8_;
          *(undefined8 *)(maxviol->m_backend).data._M_elems = local_88.data._M_elems._0_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_88.data._M_elems._8_8_;
          (maxviol->m_backend).exp = local_88.exp;
          (maxviol->m_backend).neg = local_88.neg;
          (maxviol->m_backend).fpclass = local_88.fpclass;
          (maxviol->m_backend).prec_elem = local_88.prec_elem;
        }
      }
      lVar4 = lVar4 + 0x50;
    }
    lVar4 = 0x48;
    for (lVar5 = 0; lVar5 < (this->thevectors->set).thenum; lVar5 = lVar5 + 1) {
      pnVar2 = (this->theTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x48);
      local_88.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x38);
      local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x28);
      local_88.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x18);
      local_88.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar4 + -8);
      local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar4 + -4);
      local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4);
      local_90 = 0.0;
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_88,&local_90);
      if (tVar3) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (local_38,&local_88);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_88,maxviol);
        if (tVar3) {
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_88.data._M_elems._48_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe) = local_88.data._M_elems._56_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_88.data._M_elems._32_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_88.data._M_elems._40_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_88.data._M_elems._16_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_88.data._M_elems._24_8_;
          *(undefined8 *)(maxviol->m_backend).data._M_elems = local_88.data._M_elems._0_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_88.data._M_elems._8_8_;
          (maxviol->m_backend).exp = local_88.exp;
          (maxviol->m_backend).neg = local_88.neg;
          (maxviol->m_backend).fpclass = local_88.fpclass;
          (maxviol->m_backend).prec_elem = local_88.prec_elem;
        }
      }
      lVar4 = lVar4 + 0x50;
    }
  }
  else {
    lVar4 = 0x48;
    for (lVar5 = 0; lVar5 < (this->thecovectors->set).thenum; lVar5 = lVar5 + 1) {
      pnVar2 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x48);
      local_88.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x38);
      local_88.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x28);
      local_88.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar2->m_backend).data + lVar4 + -0x18);
      local_88.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_88.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
      local_88.exp = *(int *)((long)&(pnVar2->m_backend).data + lVar4 + -8);
      local_88.neg = *(bool *)((long)&(pnVar2->m_backend).data + lVar4 + -4);
      local_88._72_8_ = *(undefined8 *)((long)&(pnVar2->m_backend).data + lVar4);
      local_90 = 0.0;
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_88,&local_90);
      if (tVar3) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (local_38,&local_88);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_88,maxviol);
        if (tVar3) {
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xc) = local_88.data._M_elems._48_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 0xe) = local_88.data._M_elems._56_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 8) = local_88.data._M_elems._32_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 10) = local_88.data._M_elems._40_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_88.data._M_elems._16_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 6) = local_88.data._M_elems._24_8_;
          *(undefined8 *)(maxviol->m_backend).data._M_elems = local_88.data._M_elems._0_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_88.data._M_elems._8_8_;
          (maxviol->m_backend).exp = local_88.exp;
          (maxviol->m_backend).neg = local_88.neg;
          (maxviol->m_backend).fpclass = local_88.fpclass;
          (maxviol->m_backend).prec_elem = local_88.prec_elem;
        }
      }
      lVar4 = lVar4 + 0x50;
    }
  }
  boost::multiprecision::backends::eval_multiply<100u,int,void>(&maxviol->m_backend,-1);
  return;
}

Assistant:

void SPxSolverBase<R>::qualRedCostViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   int i;

   // TODO:   y = c_B * B^-1  => coSolve(y, c_B)
   //         redcost = c_N - yA_N
   // solve system "x = e_i^T * B^-1" to get i'th row of B^-1
   // VectorBase<R> y( this->nRows() );
   // basis().coSolve( x, spx->unitVector( i ) );
   // VectorBase<R> rdcost( this->nCols() );
   if(type() == ENTER)
   {
      for(i = 0; i < dim(); ++i)
      {
         R x = coTest()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }

      for(i = 0; i < coDim(); ++i)
      {
         R x = test()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }
   }
   else
   {
      assert(type() == LEAVE);

      for(i = 0; i < dim(); ++i)
      {
         R x = fTest()[i];

         if(x < 0.0)
         {
            sumviol -= x;

            if(x < maxviol)
               maxviol = x;
         }
      }
   }

   maxviol *= -1;
}